

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

char * __thiscall cmState::GetGlobalProperty(cmState *this,string *prop)

{
  bool bVar1;
  char *pcVar2;
  string langs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string output;
  allocator local_91;
  string local_90;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"",(allocator *)&local_90);
  bVar1 = std::operator==(prop,"CACHE_VARIABLES");
  if (bVar1) {
    GetCacheEntryKeys_abi_cxx11_(&local_50,this);
    std::__cxx11::string::string((string *)&local_90,"CACHE_VARIABLES",&local_91);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_70,&local_50,";");
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_90,local_70._M_dataplus._M_p);
  }
  else {
    bVar1 = std::operator==(prop,"COMMANDS");
    if (!bVar1) {
      bVar1 = std::operator==(prop,"IN_TRY_COMPILE");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,"IN_TRY_COMPILE",(allocator *)&local_70);
        pcVar2 = "0";
        if (this->IsInTryCompile != false) {
          pcVar2 = "1";
        }
        cmPropertyMap::SetProperty(&this->GlobalProperties,&local_90,pcVar2);
      }
      else {
        bVar1 = std::operator==(prop,"ENABLED_LANGUAGES");
        if (!bVar1) goto LAB_0035694b;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_70,&this->EnabledLanguages,";");
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string((string *)&local_70,"ENABLED_LANGUAGES",(allocator *)&local_50)
        ;
        cmPropertyMap::SetProperty(&this->GlobalProperties,&local_70,local_90._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_0035694b;
    }
    GetCommandNames_abi_cxx11_(&local_50,this);
    std::__cxx11::string::string((string *)&local_90,"COMMANDS",&local_91);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_70,&local_50,";");
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_90,local_70._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
LAB_0035694b:
  bVar1 = std::operator==(prop,"CMAKE_C_KNOWN_FEATURES");
  if (bVar1) {
    pcVar2 = "c_function_prototypes;c_restrict;c_static_assert;c_variadic_macros";
  }
  else {
    bVar1 = std::operator==(prop,"CMAKE_CXX_KNOWN_FEATURES");
    if (bVar1) {
      pcVar2 = 
      "cxx_aggregate_default_initializers;cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_attribute_deprecated;cxx_auto_type;cxx_binary_literals;cxx_constexpr;cxx_contextual_conversions;cxx_decltype;cxx_decltype_auto;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_digit_separators;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_generic_lambdas;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_lambda_init_captures;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_template_template_parameters;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variable_templates;cxx_variadic_macros;cxx_variadic_templates"
      ;
    }
    else {
      pcVar2 = cmPropertyMap::GetPropertyValue(&this->GlobalProperties,prop);
    }
  }
  std::__cxx11::string::~string(local_38);
  return pcVar2;
}

Assistant:

const char *cmState::GetGlobalProperty(const std::string& prop)
{
  // watch for special properties
  std::string output = "";
  if ( prop == "CACHE_VARIABLES" )
    {
    std::vector<std::string> cacheKeys = this->GetCacheEntryKeys();
    this->SetGlobalProperty("CACHE_VARIABLES", cmJoin(cacheKeys, ";").c_str());
    }
  else if ( prop == "COMMANDS" )
    {
    std::vector<std::string> commands = this->GetCommandNames();
    this->SetGlobalProperty("COMMANDS", cmJoin(commands, ";").c_str());
    }
  else if ( prop == "IN_TRY_COMPILE" )
    {
    this->SetGlobalProperty("IN_TRY_COMPILE",
                      this->IsInTryCompile ? "1" : "0");
    }
  else if ( prop == "ENABLED_LANGUAGES" )
    {
    std::string langs;
    langs = cmJoin(this->EnabledLanguages, ";");
    this->SetGlobalProperty("ENABLED_LANGUAGES", langs.c_str());
    }
#define STRING_LIST_ELEMENT(F) ";" #F
  if (prop == "CMAKE_C_KNOWN_FEATURES")
    {
    return FOR_EACH_C_FEATURE(STRING_LIST_ELEMENT) + 1;
    }
  if (prop == "CMAKE_CXX_KNOWN_FEATURES")
    {
    return FOR_EACH_CXX_FEATURE(STRING_LIST_ELEMENT) + 1;
    }
#undef STRING_LIST_ELEMENT
  return this->GlobalProperties.GetPropertyValue(prop);
}